

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::Discreet3DSImporter::CanRead
          (Discreet3DSImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  undefined2 local_66;
  undefined2 local_64;
  uint16_t uStack_60;
  uint16_t token [3];
  undefined1 local_50 [8];
  string extension;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  Discreet3DSImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = checkSig;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"3ds");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"prj");
    if (!bVar1) {
      lVar2 = std::__cxx11::string::length();
      if ((lVar2 == 0) || ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) {
        local_66 = 0x4d4d;
        local_64 = 0x3dc2;
        this_local._7_1_ = BaseImporter::CheckMagicToken(pIOHandler,pFile,&local_66,2,0,2);
      }
      else {
        this_local._7_1_ = false;
      }
      goto LAB_005dabfb;
    }
  }
  this_local._7_1_ = true;
LAB_005dabfb:
  uStack_60 = 1;
  token[0] = 0;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool Discreet3DSImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const {
    std::string extension = GetExtension(pFile);
	if(extension == "3ds" || extension == "prj") {
        return true;
    }

    if (!extension.length() || checkSig) {
        uint16_t token[3];
        token[0] = 0x4d4d;
        token[1] = 0x3dc2;
        //token[2] = 0x3daa;
        return CheckMagicToken(pIOHandler,pFile,token,2,0,2);
    }
    return false;
}